

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcDar.c
# Opt level: O3

void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *pNtk,Aig_Man_t *pAig)

{
  int iVar1;
  long *plVar2;
  void *pvVar3;
  Aig_Obj_t *pAVar4;
  undefined8 uVar5;
  bool bVar6;
  uint uVar7;
  void *__ptr;
  void *__ptr_00;
  char *__s;
  size_t sVar8;
  char *__dest;
  Vec_Ptr_t *pVVar9;
  int iVar10;
  ulong uVar11;
  long lVar12;
  long lVar13;
  Aig_Man_t *pAVar14;
  Aig_Man_t *__ptr_01;
  
  iVar1 = pNtk->nObjCounts[8];
  lVar12 = (long)iVar1;
  __ptr = malloc(lVar12 * 8);
  __ptr_00 = malloc(lVar12 * 4);
  pVVar9 = pNtk->vBoxes;
  if (0 < pVVar9->nSize) {
    lVar13 = 0;
    do {
      plVar2 = (long *)pVVar9->pArray[lVar13];
      if ((*(uint *)((long)plVar2 + 0x14) & 0xf) == 8) {
        __s = Abc_ObjName(*(Abc_Obj_t **)
                           (*(long *)(*(long *)(*plVar2 + 0x20) + 8) + (long)*(int *)plVar2[6] * 8))
        ;
        sVar8 = strlen(__s);
        __dest = (char *)malloc(sVar8 + 1);
        *(char **)((long)__ptr + lVar13 * 8) = __dest;
        strcpy(__dest,__s);
        pVVar9 = pNtk->vBoxes;
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pVVar9->nSize);
  }
  pAVar14 = pAig;
  Aig_ManSetCioIds(pAig);
  if (0 < pAig->nRegs) {
    lVar13 = 0;
    bVar6 = false;
    do {
      uVar11 = (ulong)(uint)pAig->nTruePis + lVar13;
      iVar10 = (int)uVar11;
      if ((iVar10 < 0) || (pAig->vCis->nSize <= iVar10)) {
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/vec/vecPtr.h"
                      ,0x184,"void *Vec_PtrEntry(Vec_Ptr_t *, int)");
      }
      pvVar3 = pAig->vCis->pArray[uVar11 & 0xffffffff];
      *(undefined4 *)((long)__ptr_00 + lVar13 * 4) = 0;
      if (pAig->pReprs != (Aig_Obj_t **)0x0) {
        pAVar4 = pAig->pReprs[*(int *)((long)pvVar3 + 0x24)];
        if (pAVar4 != (Aig_Obj_t *)0x0) {
          uVar5 = *(undefined8 *)((long)__ptr + lVar13 * 8);
          if (!bVar6) {
            Abc_Print((int)pAVar14,"Here are the flop equivalences:\n");
          }
          if (((ulong)pAVar4 & 1) != 0) {
            __assert_fail("!Aig_IsComplement(pObj)",
                          "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/aig/aig/aig.h"
                          ,0x112,"int Aig_ObjIsConst1(Aig_Obj_t *)");
          }
          uVar7 = (uint)*(undefined8 *)&pAVar4->field_0x18 & 7;
          if (uVar7 == 2) {
            if ((pAVar4->field_0).CioId < pAig->nTruePis) goto LAB_0025642a;
            Abc_Print((int)pAVar14,"Original flop %s is proved equivalent to flop %s.\n",uVar5,
                      *(undefined8 *)
                       ((long)__ptr + (long)((pAVar4->field_0).CioId - pAig->nTruePis) * 8));
          }
          else {
            if (uVar7 != 1) {
LAB_0025642a:
              __assert_fail("Saig_ObjIsLo( pAig, pRepr )",
                            "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/base/abci/abcDar.c"
                            ,0x829,"void Abc_NtkPrintLatchEquivClasses(Abc_Ntk_t *, Aig_Man_t *)");
            }
            Abc_Print((int)pAVar14,"Original flop %s is proved equivalent to constant.\n",uVar5);
          }
          bVar6 = true;
        }
      }
      lVar13 = lVar13 + 1;
    } while (lVar13 < pAig->nRegs);
  }
  if (iVar1 < 1) {
    if (__ptr == (void *)0x0) goto LAB_002563e1;
  }
  else {
    lVar13 = 0;
    bVar6 = false;
    do {
      if (*(int *)((long)__ptr_00 + lVar13 * 4) == 0) {
        __ptr_01 = *(Aig_Man_t **)((long)__ptr + lVar13 * 8);
      }
      else {
        if (!bVar6) {
          Abc_Print((int)pAVar14,"The following flops have been deemed irrelevant:\n");
        }
        __ptr_01 = *(Aig_Man_t **)((long)__ptr + lVar13 * 8);
        Abc_Print((int)pAVar14,"%s ",__ptr_01);
        bVar6 = true;
      }
      if (__ptr_01 != (Aig_Man_t *)0x0) {
        free(__ptr_01);
        *(undefined8 *)((long)__ptr + lVar13 * 8) = 0;
        pAVar14 = __ptr_01;
      }
      lVar13 = lVar13 + 1;
    } while (lVar12 != lVar13);
    if (bVar6) {
      Abc_Print((int)pAVar14,"\n");
    }
  }
  free(__ptr);
LAB_002563e1:
  if (__ptr_00 != (void *)0x0) {
    free(__ptr_00);
    return;
  }
  return;
}

Assistant:

void Abc_NtkPrintLatchEquivClasses( Abc_Ntk_t * pNtk, Aig_Man_t * pAig )
{
    int header_dumped = 0;
    int num_orig_latches = Abc_NtkLatchNum(pNtk);
    char **pNames = ABC_ALLOC( char *, num_orig_latches );
    int *p_irrelevant = ABC_ALLOC( int, num_orig_latches );
    char * pFlopName, * pReprName;
    Aig_Obj_t * pFlop, * pRepr;
    Abc_Obj_t * pNtkFlop; 
    int repr_idx;
    int i;

    Abc_NtkForEachLatch( pNtk, pNtkFlop, i )
    {
        char *temp_name = Abc_ObjName( Abc_ObjFanout0(pNtkFlop) );
        pNames[i] = ABC_ALLOC( char , strlen(temp_name)+1);
        strcpy(pNames[i], temp_name);
    }
    i = 0;
    
    Aig_ManSetCioIds( pAig );
    Saig_ManForEachLo( pAig, pFlop, i )
    {
        p_irrelevant[i] = false;
        
        pFlopName = pNames[i];

        pRepr = Aig_ObjRepr(pAig, pFlop);

        if ( pRepr == NULL )
        {
            // Abc_Print( 1, "Nothing equivalent to flop %s\n", pFlopName);
//            p_irrelevant[i] = true;
            continue;
        }

        if (!header_dumped)
        {
            Abc_Print( 1, "Here are the flop equivalences:\n");
            header_dumped = true;
        }

        // pRepr is representative of the equivalence class, to which pFlop belongs
        if ( Aig_ObjIsConst1(pRepr) )
        {
            Abc_Print( 1, "Original flop %s is proved equivalent to constant.\n", pFlopName );
            // Abc_Print( 1, "Original flop # %d is proved equivalent to constant.\n", i );
            continue;
        }

        assert( Saig_ObjIsLo( pAig, pRepr ) );
        repr_idx = Aig_ObjCioId(pRepr) - Saig_ManPiNum(pAig);
        pReprName = pNames[repr_idx];
        Abc_Print( 1, "Original flop %s is proved equivalent to flop %s.\n",  pFlopName, pReprName );
        // Abc_Print( 1, "Original flop # %d is proved equivalent to flop # %d.\n",  i, repr_idx );
    }

    header_dumped = false;
    for (i=0; i<num_orig_latches; ++i)
    {
        if (p_irrelevant[i])
        {
            if (!header_dumped)
            {
                Abc_Print( 1, "The following flops have been deemed irrelevant:\n");
                header_dumped = true;
            }
            Abc_Print( 1, "%s ", pNames[i]);
        }
        
        ABC_FREE(pNames[i]);
    }
    if (header_dumped)
        Abc_Print( 1, "\n");
    
    ABC_FREE(pNames);
    ABC_FREE(p_irrelevant);
}